

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_pool_impl.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::file_pool_impl<libtorrent::aux::file_pool_entry>::close_oldest
          (file_pool_impl<libtorrent::aux::file_pool_entry> *this)

{
  size_traits this_00;
  unique_lock<std::mutex> l;
  int local_38;
  undefined4 uStack_34;
  size_traits sStack_30;
  node_ptr local_20;
  undefined1 local_18;
  
  local_20 = (node_ptr)&this->m_mutex;
  local_18 = 0;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&stack0xffffffffffffffe0);
  local_18 = 1;
  remove_oldest((file_pool_impl<libtorrent::aux::file_pool_entry> *)&stack0xffffffffffffffc8,
                (unique_lock<std::mutex> *)this);
  this_00.size_ = sStack_30.size_;
  sStack_30.size_ = 0;
  local_38 = 0;
  uStack_34 = 0;
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&stack0xffffffffffffffe0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00.size_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00.size_);
  }
  return;
}

Assistant:

void file_pool_impl<FileEntry>::close_oldest()
	{
		// closing a file may be long running operation (mac os x)
		// destruct it after the mutex is released
		FileHandle deferred_destruction;

		std::unique_lock<std::mutex> l(m_mutex);
		deferred_destruction = remove_oldest(l);
	}